

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

type __thiscall
fmt::v5::formatter<flow::diagnostics::Type,char,void>::
format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
          (formatter<flow::diagnostics::Type,char,void> *this,Type *v,
          basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
          *ctx)

{
  Type TVar1;
  basic_buffer<char> *this_00;
  type tVar2;
  char *out;
  uint *in_R8;
  string_view format_str;
  string_view format_str_00;
  undefined8 uStack_8;
  
  TVar1 = *v;
  this_00 = (ctx->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            ).out_.container;
  switch(TVar1) {
  case TokenError:
    out = "TokenError";
    uStack_8 = (char *)0xa;
    break;
  case SyntaxError:
    out = "SyntaxError";
    uStack_8 = (char *)0xb;
    break;
  case TypeError:
    out = "TypeError";
    goto LAB_001339c5;
  case Warning:
    out = "Warning";
    uStack_8 = (char *)0x7;
    break;
  case LinkError:
    out = "LinkError";
LAB_001339c5:
    uStack_8 = (char *)0x9;
    break;
  default:
    uStack_8 = (char *)CONCAT44(TVar1,TVar1);
    format_str_00.size_ = (long)&uStack_8 + 4;
    format_str_00.data_ = (char *)0x2;
    tVar2 = format_to<fmt::v5::internal::basic_buffer<char>,unsigned_int>
                      (this_00,(back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                               0x1767cf,format_str_00,in_R8);
    return (type)tVar2.container;
  }
  format_str.size_ = (size_t)&switchD_001339a8::switchdataD_00172a48;
  format_str.data_ = uStack_8;
  tVar2 = format_to<fmt::v5::internal::basic_buffer<char>>
                    (this_00,(back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)out,
                     format_str);
  return (type)tVar2.container;
}

Assistant:

constexpr auto format(const Type& v, FormatContext &ctx) {
      switch (v) {
        case Type::TokenError:
          return format_to(ctx.begin(), "TokenError");
        case Type::SyntaxError:
          return format_to(ctx.begin(), "SyntaxError");
        case Type::TypeError:
          return format_to(ctx.begin(), "TypeError");
        case Type::Warning:
          return format_to(ctx.begin(), "Warning");
        case Type::LinkError:
          return format_to(ctx.begin(), "LinkError");
        default:
          return format_to(ctx.begin(), "{}", static_cast<unsigned>(v));
      }
    }